

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.h
# Opt level: O1

void __thiscall Population::initialize(Population *this)

{
  Clock *pCVar1;
  Logging *pLVar2;
  allocator_type local_31;
  value_type local_30;
  vector<Event_*,_std::allocator<Event_*>_> local_28;
  
  local_30 = (value_type)0x0;
  std::vector<Event_*,_std::allocator<Event_*>_>::vector
            (&local_28,(long)this->numberOfOutputNeurons,&local_30,&local_31);
  std::vector<Event_*,_std::allocator<Event_*>_>::_M_move_assign(&this->output,&local_28);
  if (local_28.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pCVar1 = Clock::getInstance();
  this->clock = pCVar1;
  pLVar2 = Logging::getInstance();
  this->logger = pLVar2;
  return;
}

Assistant:

void initialize() {
        output = std::vector<Event*>(numberOfOutputNeurons, NULL);
        clock = Clock::getInstance();
        logger = Logging::getInstance();
    }